

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

void __thiscall tchecker::clockbounds::local_lu_map_t::~local_lu_map_t(local_lu_map_t *this)

{
  local_lu_map_t *this_local;
  
  clear(this);
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::~vector(&this->_U);
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::~vector(&this->_L);
  return;
}

Assistant:

local_lu_map_t::~local_lu_map_t() { clear(); }